

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.cc
# Opt level: O1

void __thiscall Pl_AES_PDF::setIV(Pl_AES_PDF *this,uchar *iv,size_t bytes)

{
  undefined8 uVar1;
  logic_error *this_00;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (bytes == 0x10) {
    this->use_specified_iv = true;
    uVar1 = *(undefined8 *)(iv + 8);
    *(undefined8 *)this->specified_iv = *(undefined8 *)iv;
    *(undefined8 *)(this->specified_iv + 8) = uVar1;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_58,bytes);
  std::operator+(&local_38,"Pl_AES_PDF: specified initialization vector size in bytes must be ",
                 &sStack_58);
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
Pl_AES_PDF::setIV(unsigned char const* iv, size_t bytes)
{
    if (bytes != this->buf_size) {
        throw std::logic_error(
            "Pl_AES_PDF: specified initialization vector"
            " size in bytes must be " +
            std::to_string(bytes));
    }
    this->use_specified_iv = true;
    memcpy(this->specified_iv, iv, bytes);
}